

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinprops.cpp
# Opt level: O3

void testwin2(wins *wins_ar,int ar_len)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  Am_Style local_38 [8];
  
  if (0 < ar_len) {
    lVar3 = 0;
    do {
      puVar1 = *(undefined8 **)((long)&wins_ar->root + lVar3);
      Am_Style::Am_Style(local_38,(Am_Style *)&green);
      plVar2 = (long *)(**(code **)*puVar1)
                                 (puVar1,0x366,0x50,200,200,"D2","D2 Icon",1,0,local_38,0,1,1,0,0,0,
                                  0,0,1,0);
      Am_Style::~Am_Style(local_38);
      *(long **)((long)&wins_ar->d2 + lVar3) = plVar2;
      (**(code **)(*plVar2 + 0x160))(plVar2,&Am_No_Style,&blue,2,10,0x1e,0x32,0);
      (**(code **)(*plVar2 + 0x160))(plVar2,&black,&Am_No_Style,2,0x46,0x14,0x14,0);
      (**(code **)(*plVar2 + 0xa0))(plVar2);
      lVar3 = lVar3 + 0x40;
    } while ((ulong)(uint)ar_len << 6 != lVar3);
  }
  return;
}

Assistant:

void
testwin2(wins *wins_ar, int ar_len)
{
  //printf("Hit RETURN to bring up green borderless window:");
  //getchar();
  int i;
  for (i = 0; i < ar_len; i++) {
    Am_Drawonable *the_d2 = wins_ar[i].root->Create(
        TESTWINPROPS_D2_LEFT, TESTWINPROPS_D2_TOP, 200, 200, "D2", "D2 Icon",
        true, false, green, false, 1, 1, 0, 0,
        // No title bar
        false);
    wins_ar[i].d2 = the_d2;
    the_d2->Draw_Rectangle(Am_No_Style, blue, 2, 10, 30, 50);
    the_d2->Draw_Rectangle(black, Am_No_Style, 2, 70, 20, 20);
    the_d2->Flush_Output();
  }
}